

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_do_button_text(nk_flags *state,nk_command_buffer *out,nk_rect bounds,char *string,int len,
                     nk_flags align,nk_button_behavior behavior,nk_style_button *style,nk_input *in,
                     nk_user_font *font)

{
  float fVar1;
  undefined1 local_54 [4];
  int ret;
  nk_rect content;
  nk_button_behavior behavior_local;
  nk_flags align_local;
  int len_local;
  char *string_local;
  nk_command_buffer *out_local;
  nk_flags *state_local;
  nk_rect bounds_local;
  
  bounds_local._0_8_ = bounds._8_8_;
  register0x00001200 = bounds._0_8_;
  content.w = (float)behavior;
  content.h = (float)align;
  if (state == (nk_flags *)0x0) {
    __assert_fail("state",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x3771,
                  "int nk_do_button_text(nk_flags *, struct nk_command_buffer *, struct nk_rect, const char *, int, nk_flags, enum nk_button_behavior, const struct nk_style_button *, const struct nk_input *, const struct nk_user_font *)"
                 );
  }
  if (style == (nk_style_button *)0x0) {
    __assert_fail("style",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x3772,
                  "int nk_do_button_text(nk_flags *, struct nk_command_buffer *, struct nk_rect, const char *, int, nk_flags, enum nk_button_behavior, const struct nk_style_button *, const struct nk_input *, const struct nk_user_font *)"
                 );
  }
  if (out == (nk_command_buffer *)0x0) {
    __assert_fail("out",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x3773,
                  "int nk_do_button_text(nk_flags *, struct nk_command_buffer *, struct nk_rect, const char *, int, nk_flags, enum nk_button_behavior, const struct nk_style_button *, const struct nk_input *, const struct nk_user_font *)"
                 );
  }
  if (string == (char *)0x0) {
    __assert_fail("string",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x3774,
                  "int nk_do_button_text(nk_flags *, struct nk_command_buffer *, struct nk_rect, const char *, int, nk_flags, enum nk_button_behavior, const struct nk_style_button *, const struct nk_input *, const struct nk_user_font *)"
                 );
  }
  if (font == (nk_user_font *)0x0) {
    __assert_fail("font",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x3775,
                  "int nk_do_button_text(nk_flags *, struct nk_command_buffer *, struct nk_rect, const char *, int, nk_flags, enum nk_button_behavior, const struct nk_style_button *, const struct nk_input *, const struct nk_user_font *)"
                 );
  }
  if ((((out == (nk_command_buffer *)0x0) || (style == (nk_style_button *)0x0)) ||
      (font == (nk_user_font *)0x0)) || (string == (char *)0x0)) {
    bounds_local.w = 0.0;
  }
  else {
    fVar1 = (float)nk_do_button(state,out,bounds,style,in,behavior,(nk_rect *)local_54);
    if (style->draw_begin != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
      (*style->draw_begin)(out,(nk_handle)(style->userdata).ptr);
    }
    nk_draw_button_text(out,(nk_rect *)((long)&state_local + 4),(nk_rect *)local_54,*state,style,
                        string,len,(nk_flags)content.h,font);
    bounds_local.w = fVar1;
    if (style->draw_end != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
      (*style->draw_end)(out,(nk_handle)(style->userdata).ptr);
    }
  }
  return (int)bounds_local.w;
}

Assistant:

NK_INTERN int
nk_do_button_text(nk_flags *state,
    struct nk_command_buffer *out, struct nk_rect bounds,
    const char *string, int len, nk_flags align, enum nk_button_behavior behavior,
    const struct nk_style_button *style, const struct nk_input *in,
    const struct nk_user_font *font)
{
    struct nk_rect content;
    int ret = nk_false;

    NK_ASSERT(state);
    NK_ASSERT(style);
    NK_ASSERT(out);
    NK_ASSERT(string);
    NK_ASSERT(font);
    if (!out || !style || !font || !string)
        return nk_false;

    ret = nk_do_button(state, out, bounds, style, in, behavior, &content);
    if (style->draw_begin) style->draw_begin(out, style->userdata);
    nk_draw_button_text(out, &bounds, &content, *state, style, string, len, align, font);
    if (style->draw_end) style->draw_end(out, style->userdata);
    return ret;
}